

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined4 *__ptr;
  N_Vector y;
  long *plVar3;
  long lVar4;
  long lVar5;
  FILE *pFVar6;
  N_Vector p_Var7;
  N_Vector p_Var8;
  undefined8 uVar9;
  char *pcVar10;
  sunrealtype t;
  void *cvode_mem;
  int indexB;
  sunrealtype time;
  SUNContext sunctx;
  int ncheck;
  long local_88;
  undefined4 local_7c;
  sunrealtype local_78;
  undefined8 local_70;
  N_Vector local_68;
  uint local_5c;
  N_Vector local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_88 = 0;
  puts("\nAdjoint Sensitivity Example for Chemical Kinetics");
  puts("-------------------------------------------------\n");
  puts("ODE: dy1/dt = -p1*y1 + p2*y2*y3");
  puts("     dy2/dt =  p1*y1 - p2*y2*y3 - p3*(y2)^2");
  puts("     dy3/dt =  p3*(y2)^2\n");
  puts("Find dG/dp for");
  puts("     G = int_t0^tB0 g(t,p,y) dt");
  puts("     g(t,p,y) = y3\n\n");
  __ptr = (undefined4 *)malloc(0x18);
  if (__ptr == (undefined4 *)0x0) {
    main_cold_10();
    return 1;
  }
  *__ptr = 0x47ae147b;
  __ptr[1] = 0x3fa47ae1;
  __ptr[2] = 0;
  __ptr[3] = 0x40c38800;
  *(undefined8 *)(__ptr + 4) = 0x417c9c3800000000;
  uVar2 = SUNContext_Create(0,&local_70);
  if ((int)uVar2 < 0) {
    pcVar10 = "SUNContext_Create";
LAB_00103174:
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar10,(ulong)uVar2);
    return 1;
  }
  y = (N_Vector)N_VNew_Serial(3,local_70);
  if (y == (N_Vector)0x0) {
    main_cold_9();
    return 1;
  }
  puVar1 = *(undefined8 **)((long)y->content + 0x10);
  *puVar1 = 0x3ff0000000000000;
  puVar1[1] = 0;
  puVar1[2] = 0;
  plVar3 = (long *)N_VNew_Serial(1,local_70);
  if (plVar3 == (long *)0x0) {
    main_cold_8();
    return 1;
  }
  **(undefined8 **)(*plVar3 + 0x10) = 0;
  puts("Create and allocate CVODES memory for forward runs");
  local_88 = CVodeCreate(2,local_70);
  if (local_88 == 0) {
    main_cold_7();
    return 1;
  }
  uVar2 = CVodeInit(0,local_88,f,y);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeInit";
    goto LAB_00103174;
  }
  uVar2 = CVodeWFtolerances(local_88,ewt);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeWFtolerances";
    goto LAB_00103174;
  }
  uVar2 = CVodeSetUserData(local_88,__ptr);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSetUserData";
    goto LAB_00103174;
  }
  lVar4 = SUNDenseMatrix(3,3,local_70);
  if (lVar4 == 0) {
    main_cold_6();
    return 1;
  }
  lVar5 = SUNLinSol_Dense(y,lVar4,local_70);
  if (lVar5 == 0) {
    main_cold_5();
    return 1;
  }
  uVar2 = CVodeSetLinearSolver(local_88,lVar5,lVar4);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSetLinearSolver";
    goto LAB_00103174;
  }
  uVar2 = CVodeSetJacFn(local_88,Jac);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSetJacFn";
    goto LAB_00103174;
  }
  uVar2 = CVodeQuadInit(local_88,fQ,plVar3);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeQuadInit";
    goto LAB_00103174;
  }
  uVar2 = CVodeSetQuadErrCon(local_88,1);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSetQuadErrCon";
    goto LAB_00103207;
  }
  uVar2 = CVodeQuadSStolerances(0xa0b5ed8d,0x3eb0c6f7a0b5ed8d,local_88);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeQuadSStolerances";
    goto LAB_00103207;
  }
  uVar2 = CVodeSetMaxNumSteps(local_88,0x9c4);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSetMaxNumSteps";
    goto LAB_00103207;
  }
  uVar2 = CVodeAdjInit(local_88,0x96,1);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeAdjInit";
    goto LAB_00103207;
  }
  printf("Forward integration ... ");
  uVar2 = CVodeF(0,local_88,y,&local_78,1,&local_5c);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeF";
    goto LAB_00103207;
  }
  printf("done (ncheck = %d)\n",(ulong)local_5c);
  uVar2 = CVodeGetQuad(local_88,&local_78,plVar3);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeGetQuad";
    goto LAB_00103207;
  }
  local_38 = lVar5;
  puts("--------------------------------------------------------");
  printf("G:          %12.4e \n",(int)**(undefined8 **)(*plVar3 + 0x10));
  puts("--------------------------------------------------------");
  puts("\nFinal Statistics:");
  CVodePrintAllStats(local_88,_stdout,0);
  pFVar6 = fopen("cvsRoberts_ASAi_dns_fwd_stats.csv","w");
  CVodePrintAllStats(local_88,pFVar6,1);
  fclose(pFVar6);
  p_Var7 = (N_Vector)N_VNew_Serial(3,local_70);
  if (p_Var7 == (N_Vector)0x0) {
    main_cold_4();
    return 1;
  }
  puVar1 = *(undefined8 **)((long)p_Var7->content + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  p_Var8 = (N_Vector)N_VNew_Serial(3,local_70);
  if (p_Var8 == (N_Vector)0x0) {
    main_cold_3();
    return 1;
  }
  puVar1 = *(undefined8 **)((long)p_Var8->content + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puts("\nCreate and allocate CVODES memory for backward run");
  uVar2 = CVodeCreateB(local_88,2,&local_7c);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeCreateB";
    goto LAB_00103174;
  }
  uVar2 = CVodeInitB(0,local_88,local_7c,fB,p_Var7);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeInitB";
    goto LAB_00103174;
  }
  uVar2 = CVodeSStolerancesB(0xa0b5ed8d,0x3e45798ee2308c3a,local_88,local_7c);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSStolerancesB";
    goto LAB_00103174;
  }
  uVar2 = CVodeSetUserDataB(local_88,local_7c,__ptr);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSetUserDataB";
    goto LAB_00103174;
  }
  lVar5 = SUNDenseMatrix(3,3,local_70);
  if (lVar5 == 0) {
    main_cold_2();
    return 1;
  }
  local_58 = p_Var7;
  local_48 = SUNLinSol_Dense(p_Var7,lVar5,local_70);
  if (local_48 == 0) {
    main_cold_1();
    return 1;
  }
  local_40 = lVar5;
  uVar2 = CVodeSetLinearSolverB(local_88,local_7c,local_48,lVar5);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSetLinearSolverB";
    goto LAB_00103174;
  }
  uVar2 = CVodeSetJacFnB(local_88,local_7c,JacB);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSetJacFnB";
    goto LAB_00103174;
  }
  uVar2 = CVodeQuadInitB(local_88,local_7c,fQB,p_Var8);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeQuadInitB";
    goto LAB_00103174;
  }
  local_68 = p_Var8;
  uVar2 = CVodeSetQuadErrConB(local_88,local_7c,1);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeSetQuadErrConB";
    goto LAB_00103207;
  }
  t = 1e-06;
  uVar2 = CVodeQuadSStolerancesB(local_88,local_7c);
  if ((int)uVar2 < 0) {
    pcVar10 = "CVodeQuadSStolerancesB";
    goto LAB_00103207;
  }
  printf("Backward integration from tB0 = %12.4e\n\n",0);
  uVar2 = CVodeB(0,local_88,1);
  p_Var7 = local_58;
  if (-1 < (int)uVar2) {
    uVar2 = CVodeGetB(local_88,local_7c,&local_78,local_58);
    if ((int)uVar2 < 0) {
LAB_00103007:
      pcVar10 = "CVodeGetB";
      goto LAB_00103207;
    }
    uVar2 = CVodeGetAdjY(0,local_88,y);
    if ((int)uVar2 < 0) goto LAB_00103041;
    PrintOutput1(local_78,t,y,p_Var7);
    uVar2 = CVodeB(0,local_88,1);
    if (-1 < (int)uVar2) {
      uVar2 = CVodeGetB(local_88,local_7c,&local_78,p_Var7);
      if ((int)uVar2 < 0) goto LAB_00103007;
      uVar2 = CVodeGetQuadB(local_88,local_7c,&local_78,local_68);
      if ((int)uVar2 < 0) {
LAB_00103187:
        pcVar10 = "CVodeGetQuadB";
        goto LAB_00103207;
      }
      uVar2 = CVodeGetAdjY(0,local_88,y);
      p_Var8 = local_68;
      if ((int)uVar2 < 0) goto LAB_00103041;
      local_50 = lVar4;
      PrintOutput(local_78,y,p_Var7,local_68);
      puts("\nFinal Statistics:");
      uVar9 = CVodeGetAdjCVodeBmem(local_88,local_7c);
      CVodePrintAllStats(uVar9,_stdout,0);
      pFVar6 = fopen("cvsRoberts_ASAi_dns_bkw1_stats.csv","w");
      uVar9 = CVodeGetAdjCVodeBmem(local_88,local_7c);
      CVodePrintAllStats(uVar9,pFVar6,1);
      fclose(pFVar6);
      p_Var7 = local_58;
      puVar1 = *(undefined8 **)((long)local_58->content + 0x10);
      puVar1[2] = 0;
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = *(undefined8 **)((long)p_Var8->content + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puts("\nRe-initialize CVODES memory for backward run");
      uVar2 = CVodeReInitB(0,local_88,local_7c,p_Var7);
      if ((int)uVar2 < 0) {
        pcVar10 = "CVodeReInitB";
        goto LAB_00103207;
      }
      uVar2 = CVodeQuadReInitB(local_88,local_7c,p_Var8);
      if ((int)uVar2 < 0) {
        pcVar10 = "CVodeQuadReInitB";
        goto LAB_00103207;
      }
      printf("Backward integration from tB0 = %12.4e\n\n",0);
      uVar2 = CVodeB(0,local_88,1);
      if (-1 < (int)uVar2) {
        uVar2 = CVodeGetB(local_88,local_7c,&local_78,p_Var7);
        if ((int)uVar2 < 0) goto LAB_00103007;
        uVar2 = CVodeGetAdjY(0,local_88,y);
        if (-1 < (int)uVar2) {
          PrintOutput1(local_78,t,y,p_Var7);
          uVar2 = CVodeB(0,local_88,1);
          if ((int)uVar2 < 0) goto LAB_00102fcd;
          uVar2 = CVodeGetB(local_88,local_7c,&local_78,p_Var7);
          if ((int)uVar2 < 0) goto LAB_00103007;
          uVar2 = CVodeGetQuadB(local_88,local_7c,&local_78,local_68);
          if ((int)uVar2 < 0) goto LAB_00103187;
          uVar2 = CVodeGetAdjY(0,local_88,y);
          if (-1 < (int)uVar2) {
            PrintOutput(local_78,y,p_Var7,local_68);
            puts("\nFinal Statistics:");
            uVar9 = CVodeGetAdjCVodeBmem(local_88,local_7c);
            CVodePrintAllStats(uVar9,_stdout,0);
            pFVar6 = fopen("cvsRoberts_ASAi_dns_bkw2_stats.csv","w");
            uVar9 = CVodeGetAdjCVodeBmem(local_88,local_7c);
            CVodePrintAllStats(uVar9,pFVar6,1);
            fclose(pFVar6);
            CVodeFree(&local_88);
            N_VDestroy(y);
            N_VDestroy(plVar3);
            N_VDestroy(p_Var7);
            N_VDestroy(local_68);
            SUNLinSolFree(local_38);
            SUNMatDestroy(local_50);
            SUNLinSolFree(local_48);
            SUNMatDestroy(local_40);
            SUNContext_Free(&local_70);
            free(__ptr);
            return 0;
          }
        }
LAB_00103041:
        pcVar10 = "CVodeGetAdjY";
        goto LAB_00103207;
      }
    }
  }
LAB_00102fcd:
  pcVar10 = "CVodeB";
LAB_00103207:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar10,(ulong)uVar2);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  UserData data;

  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;
  void* cvode_mem;
  FILE* FID;

  sunrealtype reltolQ, abstolQ;
  N_Vector y, q;

  int steps;

  int indexB;

  sunrealtype reltolB, abstolB, abstolQB;
  N_Vector yB, qB;

  sunrealtype time;
  int retval, ncheck;

  CVadjCheckPointRec* ckpnt;

  data = NULL;
  A = AB = NULL;
  LS = LSB  = NULL;
  cvode_mem = NULL;
  ckpnt     = NULL;
  y = yB = qB = NULL;

  /* Print problem description */
  printf("\nAdjoint Sensitivity Example for Chemical Kinetics\n");
  printf("-------------------------------------------------\n\n");
  printf("ODE: dy1/dt = -p1*y1 + p2*y2*y3\n");
  printf("     dy2/dt =  p1*y1 - p2*y2*y3 - p3*(y2)^2\n");
  printf("     dy3/dt =  p3*(y2)^2\n\n");
  printf("Find dG/dp for\n");
  printf("     G = int_t0^tB0 g(t,p,y) dt\n");
  printf("     g(t,p,y) = y3\n\n\n");

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.04);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initialize y */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  Ith(y, 1) = SUN_RCONST(1.0);
  Ith(y, 2) = ZERO;
  Ith(y, 3) = ZERO;

  /* Initialize q */
  q = N_VNew_Serial(1, sunctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Set the scalar realtive and absolute tolerances reltolQ and abstolQ */
  reltolQ = RTOL;
  abstolQ = ATOLq;

  /* Create and allocate CVODES memory for forward run */
  printf("Create and allocate CVODES memory for forward runs\n");

  /* Call CVodeCreate to create the solver memory and specify the
     Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
     user's right hand side function in y'=f(t,y), the initial time T0, and
     the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeWFtolerances to specify a user-supplied function ewt that sets
     the multiplicative error weights w_i for use in the weighted RMS norm */
  retval = CVodeWFtolerances(cvode_mem, ewt);
  if (check_retval(&retval, "CVodeWFtolerances", 1)) { return (1); }

  /* Attach user data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object for use by CVode */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine Jac */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Call CVodeQuadInit to allocate initernal memory and initialize
     quadrature integration*/
  retval = CVodeQuadInit(cvode_mem, fQ, q);
  if (check_retval(&retval, "CVodeQuadInit", 1)) { return (1); }

  /* Call CVodeSetQuadErrCon to specify whether or not the quadrature variables
     are to be used in the step size control mechanism within CVODES. Call
     CVodeQuadSStolerances or CVodeQuadSVtolerances to specify the integration
     tolerances for the quadrature variables. */
  retval = CVodeSetQuadErrCon(cvode_mem, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrCon", 1)) { return (1); }

  /* Call CVodeQuadSStolerances to specify scalar relative and absolute
     tolerances. */
  retval = CVodeQuadSStolerances(cvode_mem, reltolQ, abstolQ);
  if (check_retval(&retval, "CVodeQuadSStolerances", 1)) { return (1); }

  /* Call CVodeSetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = CVodeSetMaxNumSteps(cvode_mem, 2500);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Allocate global memory */

  /* Call CVodeAdjInit to update CVODES memory block by allocting the internal
     memory needed for backward integration.*/
  steps = STEPS; /* no. of integration steps between two consecutive ckeckpoints*/
  retval = CVodeAdjInit(cvode_mem, steps, CV_HERMITE);
  /*
  retval = CVodeAdjInit(cvode_mem, steps, CV_POLYNOMIAL);
  */
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */
  printf("Forward integration ... ");

  /* Call CVodeF to integrate the forward problem over an interval in time and
     saves checkpointing data */
  retval = CVodeF(cvode_mem, TOUT, y, &time, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("done (ncheck = %d)\n", ncheck);

  retval = CVodeGetQuad(cvode_mem, &time, q);
  if (check_retval(&retval, "CVodeGetQuad", 1)) { return (1); }

  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %12.4Le \n", Ith(q, 1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("G:          %12.4e \n", Ith(q, 1));
#else
  printf("G:          %12.4e \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n");

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(cvode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("cvsRoberts_ASAi_dns_fwd_stats.csv", "w");
  retval = CVodePrintAllStats(cvode_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Test check point linked list
     (uncomment next block to print check point information) */

  /*
  {
    int i;

    printf("\nList of Check Points (ncheck = %d)\n\n", ncheck);
    ckpnt = (CVadjCheckPointRec *) malloc ( (ncheck+1)*sizeof(CVadjCheckPointRec));
    CVodeGetAdjCheckPointsInfo(cvode_mem, ckpnt);
    for (i=0;i<=ncheck;i++) {
      printf("Address:       %p\n",ckpnt[i].my_addr);
      printf("Next:          %p\n",ckpnt[i].next_addr);
      printf("Time interval: %le  %le\n",ckpnt[i].t0, ckpnt[i].t1);
      printf("Step number:   %ld\n",ckpnt[i].nstep);
      printf("Order:         %d\n",ckpnt[i].order);
      printf("Step size:     %le\n",ckpnt[i].step);
      printf("\n");
    }

  }
  */

  /* Initialize yB */
  yB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)yB, "N_VNew_Serial", 0)) { return (1); }
  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = ZERO;

  /* Initialize qB */
  qB = N_VNew_Serial(NP, sunctx);
  if (check_retval((void*)qB, "N_VNew", 0)) { return (1); }
  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  /* Set the scalar relative tolerance reltolB */
  reltolB = RTOL;

  /* Set the scalar absolute tolerance abstolB */
  abstolB = ATOLl;

  /* Set the scalar absolute tolerance abstolQB */
  abstolQB = ATOLq;

  /* Create and allocate CVODES memory for backward run */
  printf("\nCreate and allocate CVODES memory for backward run\n");

  /* Call CVodeCreateB to specify the solution method for the backward
     problem. */
  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  /* Call CVodeInitB to allocate internal memory and initialize the
     backward problem. */
  retval = CVodeInitB(cvode_mem, indexB, fB, TB1, yB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }

  /* Set the scalar relative and absolute tolerances. */
  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  /* Attach the user data for backward problem. */
  retval = CVodeSetUserDataB(cvode_mem, indexB, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  AB = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)AB, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB = SUNLinSol_Dense(yB, AB, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, AB);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine JacB */
  retval = CVodeSetJacFnB(cvode_mem, indexB, JacB);
  if (check_retval(&retval, "CVodeSetJacFnB", 1)) { return (1); }

  /* Call CVodeQuadInitB to allocate internal memory and initialize backward
     quadrature integration. */
  retval = CVodeQuadInitB(cvode_mem, indexB, fQB, qB);
  if (check_retval(&retval, "CVodeQuadInitB", 1)) { return (1); }

  /* Call CVodeSetQuadErrCon to specify whether or not the quadrature variables
     are to be used in the step size control mechanism within CVODES. Call
     CVodeQuadSStolerances or CVodeQuadSVtolerances to specify the integration
     tolerances for the quadrature variables. */
  retval = CVodeSetQuadErrConB(cvode_mem, indexB, SUNTRUE);
  if (check_retval(&retval, "CVodeSetQuadErrConB", 1)) { return (1); }

  /* Call CVodeQuadSStolerancesB to specify the scalar relative and absolute tolerances
     for the backward problem. */
  retval = CVodeQuadSStolerancesB(cvode_mem, indexB, reltolB, abstolQB);
  if (check_retval(&retval, "CVodeQuadSStolerancesB", 1)) { return (1); }

  /* Backward Integration */

  PrintHead(TB1);

  /* First get results at t = TBout1 */

  /* Call CVodeB to integrate the backward ODE problem. */
  retval = CVodeB(cvode_mem, TBout1, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  /* Call CVodeGetB to get yB of the backward ODE problem. */
  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  /* Call CVodeGetAdjY to get the interpolated value of the forward solution
     y during a backward integration. */
  retval = CVodeGetAdjY(cvode_mem, TBout1, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput1(time, TBout1, y, yB);

  /* Then at t = T0 */

  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  /* Call CVodeGetQuadB to get the quadrature solution vector after a
     successful return from CVodeB. */
  retval = CVodeGetQuadB(cvode_mem, indexB, &time, qB);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

  retval = CVodeGetAdjY(cvode_mem, T0, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput(time, y, yB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), stdout,
                              SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("cvsRoberts_ASAi_dns_bkw1_stats.csv", "w");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), FID,
                              SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Reinitialize backward phase (new tB0) */

  Ith(yB, 1) = ZERO;
  Ith(yB, 2) = ZERO;
  Ith(yB, 3) = ZERO;

  Ith(qB, 1) = ZERO;
  Ith(qB, 2) = ZERO;
  Ith(qB, 3) = ZERO;

  printf("\nRe-initialize CVODES memory for backward run\n");

  retval = CVodeReInitB(cvode_mem, indexB, TB2, yB);
  if (check_retval(&retval, "CVodeReInitB", 1)) { return (1); }

  retval = CVodeQuadReInitB(cvode_mem, indexB, qB);
  if (check_retval(&retval, "CVodeQuadReInitB", 1)) { return (1); }

  PrintHead(TB2);

  /* First get results at t = TBout1 */

  retval = CVodeB(cvode_mem, TBout1, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetAdjY(cvode_mem, TBout1, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput1(time, TBout1, y, yB);

  /* Then at t = T0 */

  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &time, yB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  retval = CVodeGetQuadB(cvode_mem, indexB, &time, qB);
  if (check_retval(&retval, "CVodeGetQuadB", 1)) { return (1); }

  retval = CVodeGetAdjY(cvode_mem, T0, y);
  if (check_retval(&retval, "CVodeGetAdjY", 1)) { return (1); }

  PrintOutput(time, y, yB, qB);

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), stdout,
                              SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("cvsRoberts_ASAi_dns_bkw2_stats.csv", "w");
  retval = CVodePrintAllStats(CVodeGetAdjCVodeBmem(cvode_mem, indexB), FID,
                              SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  CVodeFree(&cvode_mem);
  N_VDestroy(y);
  N_VDestroy(q);
  N_VDestroy(yB);
  N_VDestroy(qB);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB);
  SUNMatDestroy(AB);
  SUNContext_Free(&sunctx);

  if (ckpnt != NULL) { free(ckpnt); }
  free(data);

  return (0);
}